

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O2

bool __thiscall Assimp::STLImporter::LoadBinaryFile(STLImporter *this)

{
  size_t __n;
  float fVar1;
  undefined8 uVar2;
  ushort uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  aiNode *paVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ushort uVar11;
  float fVar12;
  float fVar13;
  STLImporter *pSVar14;
  bool bVar15;
  uint i;
  uint uVar16;
  aiMesh **ppaVar17;
  aiMesh *this_00;
  Logger *pLVar18;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiColor4D *paVar19;
  aiColor4D *paVar20;
  aiNode *this_01;
  aiNode **ppaVar21;
  uint *puVar22;
  DeadlyImportError *pDVar23;
  ulong uVar24;
  ushort uVar25;
  long lVar26;
  aiScene *paVar27;
  long lVar28;
  ulong uVar29;
  char *pcVar30;
  allocator local_79;
  aiColor4D *local_78;
  STLImporter *local_70;
  long local_68;
  string local_60;
  aiColor4D *local_40;
  ulong local_38;
  
  this->pScene->mNumMeshes = 1;
  ppaVar17 = (aiMesh **)operator_new__(8);
  this->pScene->mMeshes = ppaVar17;
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  *this->pScene->mMeshes = this_00;
  this_00->mMaterialIndex = 0;
  if (this->fileSize < 0x54) {
    pDVar23 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_60,"STL: file is too small for the header",&local_79);
    DeadlyImportError::DeadlyImportError(pDVar23,&local_60);
    __cxa_throw(pDVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar30 = this->mBuffer;
  lVar28 = 0;
  do {
    lVar26 = lVar28;
    if (0x4f < lVar26) goto LAB_0051fb56;
    lVar28 = lVar26 + 1;
  } while (((((pcVar30[lVar26] != 'C') || (lVar28 = lVar26 + 2, pcVar30[lVar26 + 1] != 'O')) ||
            (lVar28 = lVar26 + 3, pcVar30[lVar26 + 2] != 'L')) ||
           ((lVar28 = lVar26 + 4, pcVar30[lVar26 + 3] != 'O' ||
            (lVar28 = lVar26 + 5, pcVar30[lVar26 + 4] != 'R')))) ||
          (lVar28 = lVar26 + 6, pcVar30[lVar26 + 5] != '='));
  pLVar18 = DefaultLogger::get();
  Logger::info(pLVar18,"STL: Taking code path for Materialise files");
  (this->clrColorDefault).r = (float)(byte)pcVar30[lVar26 + 6] * 0.003921569;
  (this->clrColorDefault).g = (float)(byte)pcVar30[lVar26 + 7] * 0.003921569;
  (this->clrColorDefault).b = (float)(byte)pcVar30[lVar26 + 8] * 0.003921569;
  (this->clrColorDefault).a = (float)(byte)pcVar30[lVar26 + 9] * 0.003921569;
  pcVar30 = this->mBuffer;
LAB_0051fb56:
  aiString::Set(&this->pScene->mRootNode->mName,"<STL_BINARY>");
  uVar16 = *(uint *)(pcVar30 + 0x50);
  this_00->mNumFaces = uVar16;
  if (this->fileSize < uVar16 * 0x32 + 0x54) {
    pDVar23 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_60,"STL: file is too small to hold all facets",&local_79);
    DeadlyImportError::DeadlyImportError(pDVar23,&local_60);
    __cxa_throw(pDVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_70 = this;
  local_68 = lVar26;
  if (uVar16 != 0) {
    pcVar30 = pcVar30 + 0x54;
    this_00->mNumVertices = uVar16 * 3;
    uVar29 = (ulong)(uVar16 * 3) * 0xc;
    __s = (aiVector3D *)operator_new__(uVar29);
    __n = uVar29 - (uVar29 - 0xc) % 0xc;
    memset(__s,0,__n);
    this_00->mVertices = __s;
    __s_00 = (aiVector3D *)operator_new__(uVar29);
    memset(__s_00,0,__n);
    this_00->mNormals = __s_00;
    local_40 = &local_70->clrColorDefault;
    lVar28 = local_68;
    for (uVar29 = 0; uVar29 < uVar16; uVar29 = uVar29 + 1) {
      fVar1 = *(float *)(pcVar30 + 8);
      uVar2 = *(undefined8 *)pcVar30;
      __s_00->x = (float)(int)uVar2;
      __s_00->y = (float)(int)((ulong)uVar2 >> 0x20);
      __s_00->z = fVar1;
      uVar4 = __s_00->x;
      uVar6 = __s_00->y;
      __s_00[1].x = (float)uVar4;
      __s_00[1].y = (float)uVar6;
      fVar1 = __s_00->z;
      __s_00[1].z = fVar1;
      __s_00[2].x = (float)uVar4;
      __s_00[2].y = (float)uVar6;
      __s_00[2].z = fVar1;
      fVar1 = *(float *)(pcVar30 + 0x14);
      uVar2 = *(undefined8 *)(pcVar30 + 0xc);
      __s->x = (float)(int)uVar2;
      __s->y = (float)(int)((ulong)uVar2 >> 0x20);
      __s->z = fVar1;
      fVar1 = *(float *)(pcVar30 + 0x20);
      uVar2 = *(undefined8 *)(pcVar30 + 0x18);
      __s[1].x = (float)(int)uVar2;
      __s[1].y = (float)(int)((ulong)uVar2 >> 0x20);
      __s[1].z = fVar1;
      fVar1 = *(float *)(pcVar30 + 0x2c);
      uVar2 = *(undefined8 *)(pcVar30 + 0x24);
      __s[2].x = (float)(int)uVar2;
      __s[2].y = (float)(int)((ulong)uVar2 >> 0x20);
      __s[2].z = fVar1;
      uVar3 = *(ushort *)(pcVar30 + 0x30);
      if ((short)uVar3 < 0) {
        paVar20 = this_00->mColors[0];
        if (paVar20 == (aiColor4D *)0x0) {
          uVar24 = (ulong)this_00->mNumVertices;
          local_78 = (aiColor4D *)(uVar24 << 4);
          local_38 = uVar29;
          paVar19 = (aiColor4D *)operator_new__((ulong)local_78);
          paVar20 = local_78;
          if (uVar24 != 0) {
            local_78 = paVar19;
            memset(paVar19,0,(size_t)paVar20);
            paVar19 = local_78;
          }
          this_00->mColors[0] = paVar19;
          for (uVar16 = 0; paVar20 = this_00->mColors[0], uVar16 < (uint)uVar24; uVar16 = uVar16 + 1
              ) {
            this_00->mColors[0] = paVar20 + 1;
            fVar1 = local_40->g;
            fVar12 = local_40->b;
            fVar13 = local_40->a;
            paVar20->r = local_40->r;
            paVar20->g = fVar1;
            paVar20->b = fVar12;
            paVar20->a = fVar13;
            uVar24 = (ulong)this_00->mNumVertices;
          }
          this_00->mColors[0] = paVar20 + -uVar24;
          pLVar18 = DefaultLogger::get();
          Logger::info(pLVar18,"STL: Mesh has vertex colors");
          paVar20 = this_00->mColors[0];
          lVar28 = local_68;
          uVar29 = local_38;
        }
        uVar24 = (ulong)(uint)((int)uVar29 * 3);
        uVar25 = uVar3 >> 10;
        uVar11 = uVar3;
        if (0x4f < lVar28) {
          uVar25 = uVar3;
          uVar11 = uVar3 >> 10;
        }
        paVar20[uVar24].a = 1.0;
        paVar20[uVar24].r = (float)(uVar11 & 0x31) * 0.032258064;
        paVar20[uVar24].g = (float)(uVar3 >> 5 & 0x31) * 0.032258064;
        paVar20[uVar24].b = (float)(uVar25 & 0x31) * 0.032258064;
        paVar19 = paVar20 + uVar24;
        uVar7 = paVar19->r;
        uVar8 = paVar19->g;
        uVar9 = paVar19->b;
        uVar10 = paVar19->a;
        paVar19 = paVar20 + uVar24 + 1;
        paVar19->r = (float)uVar7;
        paVar19->g = (float)uVar8;
        paVar19->b = (float)uVar9;
        paVar19->a = (float)uVar10;
        paVar20 = paVar20 + uVar24 + 2;
        paVar20->r = (float)uVar7;
        paVar20->g = (float)uVar8;
        paVar20->b = (float)uVar9;
        paVar20->a = (float)uVar10;
        uVar16 = this_00->mNumFaces;
      }
      __s_00 = __s_00 + 3;
      __s = __s + 3;
      pcVar30 = pcVar30 + 0x32;
    }
    addFacesToMesh(this_00);
    pSVar14 = local_70;
    paVar5 = local_70->pScene->mRootNode;
    this_01 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_01);
    this_01->mParent = paVar5;
    paVar5->mNumChildren = 1;
    ppaVar21 = (aiNode **)operator_new__(8);
    paVar5->mChildren = ppaVar21;
    *ppaVar21 = this_01;
    paVar27 = pSVar14->pScene;
    uVar16 = paVar27->mNumMeshes;
    this_01->mNumMeshes = uVar16;
    puVar22 = (uint *)operator_new__((ulong)uVar16 << 2);
    this_01->mMeshes = puVar22;
    for (uVar29 = 0; uVar29 < paVar27->mNumMeshes; uVar29 = uVar29 + 1) {
      this_01->mMeshes[uVar29] = (uint)uVar29;
      paVar27 = pSVar14->pScene;
    }
    if ((lVar28 < 0x50) && (this_00->mColors[0] == (aiColor4D *)0x0)) {
      bVar15 = true;
    }
    else {
      bVar15 = false;
    }
    return bVar15;
  }
  pDVar23 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_60,"STL: file is empty. There are no facets defined",&local_79);
  DeadlyImportError::DeadlyImportError(pDVar23,&local_60);
  __cxa_throw(pDVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool STLImporter::LoadBinaryFile()
{
    // allocate one mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pMesh = pScene->mMeshes[0] = new aiMesh();
    pMesh->mMaterialIndex = 0;

    // skip the first 80 bytes
    if (fileSize < 84) {
        throw DeadlyImportError("STL: file is too small for the header");
    }
    bool bIsMaterialise = false;

    // search for an occurrence of "COLOR=" in the header
    const unsigned char* sz2 = (const unsigned char*)mBuffer;
    const unsigned char* const szEnd = sz2+80;
    while (sz2 < szEnd) {

        if ('C' == *sz2++ && 'O' == *sz2++ && 'L' == *sz2++ &&
            'O' == *sz2++ && 'R' == *sz2++ && '=' == *sz2++)    {

            // read the default vertex color for facets
            bIsMaterialise = true;
            ASSIMP_LOG_INFO("STL: Taking code path for Materialise files");
            const ai_real invByte = (ai_real)1.0 / ( ai_real )255.0;
            clrColorDefault.r = (*sz2++) * invByte;
            clrColorDefault.g = (*sz2++) * invByte;
            clrColorDefault.b = (*sz2++) * invByte;
            clrColorDefault.a = (*sz2++) * invByte;
            break;
        }
    }
    const unsigned char* sz = (const unsigned char*)mBuffer + 80;

    // now read the number of facets
    pScene->mRootNode->mName.Set("<STL_BINARY>");

    pMesh->mNumFaces = *((uint32_t*)sz);
    sz += 4;

    if (fileSize < 84 + pMesh->mNumFaces*50) {
        throw DeadlyImportError("STL: file is too small to hold all facets");
    }

    if (!pMesh->mNumFaces) {
        throw DeadlyImportError("STL: file is empty. There are no facets defined");
    }

    pMesh->mNumVertices = pMesh->mNumFaces*3;

    
    aiVector3D *vp = pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
    aiVector3D *vn = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    typedef aiVector3t<float> aiVector3F;
    aiVector3F* theVec;
    aiVector3F theVec3F;
    
    for ( unsigned int i = 0; i < pMesh->mNumFaces; ++i ) {
        // NOTE: Blender sometimes writes empty normals ... this is not
        // our fault ... the RemoveInvalidData helper step should fix that

        // There's one normal for the face in the STL; use it three times
        // for vertex normals
        theVec = (aiVector3F*) sz;
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vn->x = theVec3F.x; vn->y = theVec3F.y; vn->z = theVec3F.z;
        *(vn+1) = *vn;
        *(vn+2) = *vn;
        ++theVec;
        vn += 3;

        // vertex 1
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 2
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 3
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;
        
        sz = (const unsigned char*) theVec;

        uint16_t color = *((uint16_t*)sz);
        sz += 2;

        if (color & (1 << 15))
        {
            // seems we need to take the color
            if (!pMesh->mColors[0])
            {
                pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
                for (unsigned int i = 0; i <pMesh->mNumVertices;++i)
                    *pMesh->mColors[0]++ = this->clrColorDefault;
                pMesh->mColors[0] -= pMesh->mNumVertices;

                ASSIMP_LOG_INFO("STL: Mesh has vertex colors");
            }
            aiColor4D* clr = &pMesh->mColors[0][i*3];
            clr->a = 1.0;
            const ai_real invVal( (ai_real)1.0 / ( ai_real )31.0 );
            if (bIsMaterialise) // this is reversed
            {
                clr->r = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->b = ((color & (0x31u<<10))>>10u) *invVal;
            }
            else
            {
                clr->b = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->r = ((color & (0x31u<<10))>>10u) *invVal;
            }
            // assign the color to all vertices of the face
            *(clr+1) = *clr;
            *(clr+2) = *clr;
        }
    }

    // now copy faces
    addFacesToMesh(pMesh);

    aiNode* root = pScene->mRootNode;

    // allocate one node
    aiNode* node = new aiNode();
    node->mParent = root;

    root->mNumChildren = 1u;
    root->mChildren = new aiNode*[root->mNumChildren];
    root->mChildren[0] = node;

    // add all created meshes to the single node
    node->mNumMeshes = pScene->mNumMeshes;
    node->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; i++)
        node->mMeshes[i] = i;

    if (bIsMaterialise && !pMesh->mColors[0])
    {
        // use the color as diffuse material color
        return true;
    }
    return false;
}